

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

LightLiSample * __thiscall
pbrt::PortalImageInfiniteLight::SampleLi
          (LightLiSample *__return_storage_ptr__,PortalImageInfiniteLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  undefined8 uVar1;
  Interval<float> IVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  Point3fi *pPVar9;
  Point3fi *pPVar10;
  uintptr_t iptr;
  undefined1 auVar11 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar12 [64];
  undefined1 auVar16 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar19 [56];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  Bounds2f BVar24;
  SampledSpectrum SVar25;
  Vector3f VVar26;
  float local_7c;
  Tuple3<pbrt::Point3,_float> local_78;
  float local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  Tuple2<pbrt::Point2,_float> local_40;
  Bounds2f local_38;
  undefined1 extraout_var [56];
  
  auVar12._8_56_ = in_register_00001208;
  auVar12._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  local_40 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar12._0_16_);
  auVar6 = vinsertps_avx(ctx.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_,
                         ZEXT416((uint)ctx.pi.super_Point3<pbrt::Interval<float>_>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high),
                         0x10);
  auVar11._0_4_ =
       ctx.pi.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar6._0_4_;
  auVar11._4_4_ =
       ctx.pi.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar6._4_4_;
  auVar11._8_4_ = auVar6._8_4_ + 0.0;
  auVar11._12_4_ = auVar6._12_4_ + 0.0;
  auVar6._8_4_ = 0x3f000000;
  auVar6._0_8_ = 0x3f0000003f000000;
  auVar6._12_4_ = 0x3f000000;
  local_58 = vmulps_avx512vl(auVar11,auVar6);
  auVar19 = ZEXT856(local_58._8_8_);
  fVar7 = (ctx.pi.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
          ctx.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
  auVar16 = (undefined1  [56])0x0;
  local_78._0_8_ = vmovlps_avx(local_58);
  local_78.z = fVar7;
  BVar24 = ImageBounds(this,(Point3f *)&local_78);
  auVar17._0_8_ = BVar24.pMax.super_Tuple2<pbrt::Point2,_float>;
  auVar17._8_56_ = auVar19;
  auVar13._0_8_ = BVar24.pMin.super_Tuple2<pbrt::Point2,_float>;
  auVar13._8_56_ = auVar16;
  local_38 = (Bounds2f)vmovlhps_avx(auVar13._0_16_,auVar17._0_16_);
  auVar14._0_8_ =
       WindowedPiecewiseConstant2D::Sample
                 (&this->distribution,(Point2f *)&local_40,&local_38,&local_7c);
  auVar14._8_56_ = extraout_var;
  local_78._0_8_ = vmovlps_avx(auVar14._0_16_);
  uStack_60 = 0;
  if ((local_7c != 0.0) || (NAN(local_7c))) {
    VVar26 = RenderFromImage(this,(Point2f *)&local_78,&local_6c);
    local_68 = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    if ((local_6c != 0.0) || (NAN(local_6c))) {
      auVar19 = (undefined1  [56])0x0;
      auVar16 = ZEXT856(0);
      if (ABS(local_7c / local_6c) != INFINITY) {
        SVar25 = ImageLookup(this,(Point2f *)&local_78,&lambda);
        auVar18._0_8_ = SVar25.values.values._8_8_;
        auVar18._8_56_ = auVar19;
        auVar15._0_8_ = SVar25.values.values._0_8_;
        auVar15._8_56_ = auVar16;
        fVar3 = this->sceneRadius + this->sceneRadius;
        auVar8._8_8_ = uStack_60;
        auVar8._0_8_ = local_68;
        auVar6 = vmovshdup_avx(auVar8);
        fVar4 = local_58._0_4_ + (float)local_68 * fVar3;
        auVar11 = vmovshdup_avx(local_58);
        fVar5 = auVar11._0_4_ + auVar6._0_4_ * fVar3;
        fVar7 = VVar26.super_Tuple3<pbrt::Vector3,_float>.z * fVar3 + fVar7;
        auVar21._4_4_ = fVar4;
        auVar21._0_4_ = fVar4;
        auVar21._8_4_ = fVar4;
        auVar21._12_4_ = fVar4;
        auVar22._4_4_ = fVar5;
        auVar22._0_4_ = fVar5;
        auVar22._8_4_ = fVar5;
        auVar22._12_4_ = fVar5;
        auVar6 = vmovlhps_avx(auVar21,auVar22);
        auVar20._4_4_ = fVar7;
        auVar20._0_4_ = fVar7;
        auVar20._8_4_ = fVar7;
        auVar20._12_4_ = fVar7;
        auVar23 = ZEXT432(0) << 0x20;
        (__return_storage_ptr__->pLight).wo = (Vector3f)auVar23._0_12_;
        (__return_storage_ptr__->pLight).n = (Normal3f)auVar23._12_12_;
        (__return_storage_ptr__->pLight).uv = (Point2f)auVar23._24_8_;
        auVar11 = vmovlhps_avx(auVar15._0_16_,auVar18._0_16_);
        *(undefined1 (*) [16])(__return_storage_ptr__->L).values.values = auVar11;
        uVar1 = vmovlps_avx(auVar8);
        (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
        (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)uVar1 >> 0x20);
        (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z =
             VVar26.super_Tuple3<pbrt::Vector3,_float>.z;
        __return_storage_ptr__->pdf = local_7c / local_6c;
        (__return_storage_ptr__->light).
        super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
        .bits = (ulong)this | 0x9000000000000;
        pPVar9 = &(__return_storage_ptr__->pLight).pi;
        pPVar10 = &(__return_storage_ptr__->pLight).pi;
        (pPVar9->super_Point3<pbrt::Interval<float>_>).
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = (float)(int)auVar6._0_8_;
        (pPVar9->super_Point3<pbrt::Interval<float>_>).
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high =
             (float)(int)((ulong)auVar6._0_8_ >> 0x20);
        (pPVar10->super_Point3<pbrt::Interval<float>_>).
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = (float)(int)auVar6._8_8_;
        (pPVar10->super_Point3<pbrt::Interval<float>_>).
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high =
             (float)(int)((ulong)auVar6._8_8_ >> 0x20);
        IVar2 = (Interval<float>)vmovlps_avx(auVar20);
        (__return_storage_ptr__->pLight).pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = IVar2;
        (__return_storage_ptr__->pLight).time = 0.0;
        (__return_storage_ptr__->pLight).mediumInterface = &(this->super_LightBase).mediumInterface;
        (__return_storage_ptr__->pLight).medium.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = 0;
        return __return_storage_ptr__;
      }
      LogFatal<char_const(&)[12]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
                 ,0x443,"Check failed: %s",(char (*) [12])"!IsInf(pdf)");
    }
  }
  pPVar9 = &(__return_storage_ptr__->pLight).pi;
  (pPVar9->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  z.low = 0.0;
  (pPVar9->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  z.high = 0.0;
  (__return_storage_ptr__->pLight).time = 0.0;
  (__return_storage_ptr__->pLight).wo.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->pLight).wo.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (__return_storage_ptr__->pLight).wo.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  (__return_storage_ptr__->pLight).n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  (__return_storage_ptr__->pLight).n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->pLight).n.super_Tuple3<pbrt::Normal3,_float>.z = 0;
  *(undefined8 *)&(__return_storage_ptr__->pLight).uv.super_Tuple2<pbrt::Point2,_float>.y = 0;
  (__return_storage_ptr__->pLight).mediumInterface = (MediumInterface *)0x0;
  (__return_storage_ptr__->pLight).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (__return_storage_ptr__->L).values.values[0] = 0.0;
  (__return_storage_ptr__->L).values.values[1] = 0.0;
  (__return_storage_ptr__->L).values.values[2] = 0.0;
  (__return_storage_ptr__->L).values.values[3] = 0.0;
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = 0;
  (__return_storage_ptr__->light).
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits = 0;
  pPVar9 = &(__return_storage_ptr__->pLight).pi;
  (pPVar9->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  x.low = 0.0;
  (pPVar9->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  x.high = 0.0;
  pPVar9 = &(__return_storage_ptr__->pLight).pi;
  (pPVar9->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  y.low = 0.0;
  (pPVar9->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  y.high = 0.0;
  pPVar9 = &(__return_storage_ptr__->pLight).pi;
  (pPVar9->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  z.low = 0.0;
  (pPVar9->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  z.high = 0.0;
  return __return_storage_ptr__;
}

Assistant:

LightLiSample PortalImageInfiniteLight::SampleLi(LightSampleContext ctx, Point2f u,
                                                 SampledWavelengths lambda,
                                                 LightSamplingMode mode) const {
    Bounds2f b = ImageBounds(ctx.p());

    // Find $(u,v)$ sample coordinates in infinite light texture
    Float mapPDF;
    Point2f uv = distribution.Sample(u, b, &mapPDF);
    if (mapPDF == 0)
        return {};

    // Convert infinite light sample point to direction
    // Note: ignore WorldToLight since we already folded it in when we
    // resampled...
    Float duv_dw;
    Vector3f wi = RenderFromImage(uv, &duv_dw);
    if (duv_dw == 0)
        return {};

    // Compute PDF for sampled infinite light direction
    Float pdf = mapPDF / duv_dw;
    CHECK(!IsInf(pdf));

    SampledSpectrum L = ImageLookup(uv, lambda);

    return LightLiSample(
        this, L, wi, pdf,
        Interaction(ctx.p() + wi * (2 * sceneRadius), 0 /* time */, &mediumInterface));
}